

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArchiveWrite.cxx
# Opt level: O2

bool __thiscall
cmArchiveWrite::AddPath(cmArchiveWrite *this,char *path,size_t skip,char *prefix,bool recursive)

{
  bool bVar1;
  bool bVar2;
  unsigned_long uVar3;
  char *pcVar4;
  unsigned_long i;
  unsigned_long dindex;
  allocator<char> local_82;
  allocator<char> local_81;
  string next;
  Directory d;
  
  bVar1 = AddFile(this,path,skip,prefix);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&next,path,&local_82);
    bVar1 = cmsys::SystemTools::FileIsDirectory(&next);
    if (bVar1 && recursive) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&d,path,&local_81);
      bVar2 = cmsys::SystemTools::FileIsSymlink((string *)&d);
      std::__cxx11::string::~string((string *)&d);
      std::__cxx11::string::~string((string *)&next);
      bVar1 = true;
      if (!bVar2) {
        cmsys::Directory::Directory(&d);
        std::__cxx11::string::string<std::allocator<char>>((string *)&next,path,&local_82);
        bVar2 = cmsys::Directory::Load(&d,&next);
        std::__cxx11::string::~string((string *)&next);
        bVar1 = true;
        if (bVar2) {
          std::__cxx11::string::string<std::allocator<char>>((string *)&next,path,&local_82);
          std::__cxx11::string::append((char *)&next);
          uVar3 = cmsys::Directory::GetNumberOfFiles(&d);
          for (dindex = 0; uVar3 != dindex; dindex = dindex + 1) {
            pcVar4 = cmsys::Directory::GetFile(&d,dindex);
            if ((*pcVar4 != '.') ||
               ((pcVar4[1] != '\0' && ((pcVar4[1] != '.' || (pcVar4[2] != '\0')))))) {
              std::__cxx11::string::erase((ulong)&next,next._M_string_length);
              std::__cxx11::string::append((char *)&next);
              bVar2 = AddPath(this,next._M_dataplus._M_p,skip,prefix,true);
              if (!bVar2) {
                std::__cxx11::string::~string((string *)&next);
                bVar1 = false;
                goto LAB_001eaeea;
              }
            }
          }
          std::__cxx11::string::~string((string *)&next);
        }
LAB_001eaeea:
        cmsys::Directory::~Directory(&d);
      }
    }
    else {
      std::__cxx11::string::~string((string *)&next);
      bVar1 = true;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool cmArchiveWrite::AddPath(const char* path, size_t skip, const char* prefix,
                             bool recursive)
{
  if (!this->AddFile(path, skip, prefix)) {
    return false;
  }
  if ((!cmSystemTools::FileIsDirectory(path) || !recursive) ||
      cmSystemTools::FileIsSymlink(path)) {
    return true;
  }
  cmsys::Directory d;
  if (d.Load(path)) {
    std::string next = path;
    next += "/";
    std::string::size_type end = next.size();
    unsigned long n = d.GetNumberOfFiles();
    for (unsigned long i = 0; i < n; ++i) {
      const char* file = d.GetFile(i);
      if (strcmp(file, ".") != 0 && strcmp(file, "..") != 0) {
        next.erase(end);
        next += file;
        if (!this->AddPath(next.c_str(), skip, prefix)) {
          return false;
        }
      }
    }
  }
  return true;
}